

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O2

void Fra_OneHotCheck(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pOld;
  Aig_Obj_t *pNew;
  int iVar4;
  int iVar5;
  uint uVar6;
  int i;
  
  iVar4 = p->pManFraig->nObjs[3] - p->pManFraig->nRegs;
  i = 1;
  do {
    iVar5 = i + -1;
    if (vOneHots->nSize <= iVar5) {
      return;
    }
    uVar1 = Vec_IntEntry(vOneHots,iVar5);
    uVar2 = Vec_IntEntry(vOneHots,i);
    if (uVar1 != 0 || uVar2 != 0) {
      uVar6 = ~uVar1;
      if (0 < (int)uVar1) {
        uVar6 = uVar1 - 1;
      }
      pOld = Aig_ManCo(p->pManFraig,uVar6 + iVar4);
      uVar6 = ~uVar2;
      if (0 < (int)uVar2) {
        uVar6 = uVar2 - 1;
      }
      pNew = Aig_ManCo(p->pManFraig,uVar6 + iVar4);
      iVar3 = Fra_NodesAreClause(p,pOld,pNew,uVar1 >> 0x1f,uVar2 >> 0x1f);
      if (iVar3 != 1) {
        p->pCla->fRefinement = 1;
        if (iVar3 == 0) {
          Fra_SmlResimulate(p);
        }
        iVar3 = Vec_IntEntry(vOneHots,iVar5);
        if (iVar3 != 0) {
          puts("Fra_OneHotCheck(): Clause is not refined!");
        }
        iVar5 = Vec_IntEntry(vOneHots,iVar5);
        if (iVar5 != 0) {
          __assert_fail("Vec_IntEntry(vOneHots, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                        ,0xfa,"void Fra_OneHotCheck(Fra_Man_t *, Vec_Int_t *)");
        }
      }
    }
    i = i + 2;
  } while( true );
}

Assistant:

void Fra_OneHotCheck( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int RetValue, i, Out1, Out2;
    int nTruePos = Aig_ManCoNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out2) );
        RetValue = Fra_NodesAreClause( p, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vOneHots, i) != 0 )
                printf( "Fra_OneHotCheck(): Clause is not refined!\n" );
            assert( Vec_IntEntry(vOneHots, i) == 0 );
        }
    }
}